

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O0

uint32_t __thiscall spvtools::opt::Operand::AsId(Operand *this)

{
  bool bVar1;
  size_t sVar2;
  uint *puVar3;
  Operand *this_local;
  
  bVar1 = spvIsIdType(this->type);
  if (!bVar1) {
    __assert_fail("spvIsIdType(type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                  ,0x60,"uint32_t spvtools::opt::Operand::AsId() const");
  }
  sVar2 = utils::SmallVector<unsigned_int,_2UL>::size(&this->words);
  if (sVar2 == 1) {
    puVar3 = utils::SmallVector<unsigned_int,_2UL>::operator[](&this->words,0);
    return *puVar3;
  }
  __assert_fail("words.size() == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                ,0x61,"uint32_t spvtools::opt::Operand::AsId() const");
}

Assistant:

uint32_t AsId() const {
    assert(spvIsIdType(type));
    assert(words.size() == 1);
    return words[0];
  }